

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void new_localvar(LexState *ls,TString *name,ravi_type_map tm,TString *usertype)

{
  undefined8 *puVar1;
  FuncState *fs;
  Dyndata *pDVar2;
  Proto *o;
  byte bVar3;
  int iVar4;
  LocVar *pLVar5;
  Vardesc *block;
  ulong uVar6;
  short sVar7;
  long lVar8;
  char *__assertion;
  
  fs = ls->fs;
  pDVar2 = ls->dyd;
  o = fs->f;
  iVar4 = o->sizelocvars;
  lVar8 = (long)iVar4;
  if (iVar4 <= fs->nlocvars) {
    pLVar5 = (LocVar *)luaM_growaux_(ls->L,o->locvars,&o->sizelocvars,0x20,0x7fff,"local variables")
    ;
    o->locvars = pLVar5;
    iVar4 = o->sizelocvars;
  }
  uVar6 = lVar8 << 5 | 0x18;
  for (; pLVar5 = o->locvars, lVar8 < iVar4; lVar8 = lVar8 + 1) {
    *(undefined8 *)((long)pLVar5 + (uVar6 - 8)) = 0xffffffffffffffff;
    *(undefined4 *)((long)&pLVar5->varname + uVar6) = 0xffffffff;
    puVar1 = (undefined8 *)((long)pLVar5 + (uVar6 - 0x18));
    *puVar1 = 0;
    puVar1[1] = 0;
    uVar6 = uVar6 + 0x20;
  }
  sVar7 = fs->nlocvars;
  pLVar5[sVar7].varname = name;
  pLVar5[sVar7].ravi_type_map = tm;
  pLVar5[sVar7].usertype = usertype;
  if (((o->marked & 0x20) != 0) && ((name->marked & 0x18) != 0)) {
    if ((o->tt & 0xe) < 10) {
      if ((name->tt & 0xe) < 10) {
        luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)name);
        sVar7 = fs->nlocvars;
        goto LAB_00135056;
      }
      __assertion = "(((varname)->tt) & 0x0F) < (9+1)";
    }
    else {
      __assertion = "(((f)->tt) & 0x0F) < (9+1)";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x19e,"int registerlocalvar(LexState *, TString *, ravi_type_map, TString *)");
  }
LAB_00135056:
  fs->nlocvars = sVar7 + 1;
  checklimit(fs,((pDVar2->actvar).n - fs->firstlocal) + 1,0x7d,"local variables");
  iVar4 = (pDVar2->actvar).n;
  block = (pDVar2->actvar).arr;
  if ((pDVar2->actvar).size < iVar4 + 2) {
    block = (Vardesc *)
            luaM_growaux_(ls->L,block,&(pDVar2->actvar).size,2,0x7fffffff,"local variables");
    (pDVar2->actvar).arr = block;
    iVar4 = (pDVar2->actvar).n;
  }
  block[iVar4].idx = sVar7;
  if (((byte)ravi_parser_debug & 4) == 0) {
    (pDVar2->actvar).n = iVar4 + 1;
  }
  else {
    raviY_printf(fs,"new_localvar -> registering %v fs->f->locvars[%d] at ls->dyd->actvar.arr[%d]\n"
                 ,fs->f->locvars + sVar7,(ulong)(uint)(int)sVar7);
    bVar3 = (byte)ravi_parser_debug & 4;
    (pDVar2->actvar).n = (pDVar2->actvar).n + 1;
    if (bVar3 != 0) {
      raviY_printf(fs,"new_localvar -> ls->dyd->actvar.n set to %d\n");
      return;
    }
  }
  return;
}

Assistant:

static void new_localvar (LexState *ls, TString *name, ravi_type_map tm, TString *usertype) {
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  /* register variable and get its index */
  /* RAVI change - record type info for local variable */
  int reg = registerlocalvar(ls, name, tm, usertype);
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                  MAXVARS, "local variables");
  luaM_growvector(ls->L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, MAX_INT, "local variables");
  /* variable will be placed at stack position dyd->actvar.n */
  dyd->actvar.arr[dyd->actvar.n].idx = cast(short, reg);
  DEBUG_VARS(raviY_printf(fs, "new_localvar -> registering %v fs->f->locvars[%d] at ls->dyd->actvar.arr[%d]\n", &fs->f->locvars[reg], reg, dyd->actvar.n));
  dyd->actvar.n++;
  DEBUG_VARS(raviY_printf(fs, "new_localvar -> ls->dyd->actvar.n set to %d\n", dyd->actvar.n));
}